

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g2d.c
# Opt level: O1

int g2d_line_intersect_line(g2d_line_t *linea,g2d_line_t *lineb,double *p)

{
  int iVar1;
  double dVar2;
  
  dVar2 = linea->u[1] * lineb->u[0] - linea->u[0] * lineb->u[1];
  iVar1 = 0;
  if ((1e-08 <= ABS(dVar2)) && (iVar1 = 1, p != (double *)0x0)) {
    dVar2 = (lineb->p[1] - linea->p[1]) * (lineb->u[0] / dVar2) +
            (lineb->p[0] - linea->p[0]) * (-lineb->u[1] / dVar2);
    *p = linea->u[0] * dVar2 + linea->p[0];
    p[1] = dVar2 * linea->u[1] + linea->p[1];
  }
  return iVar1;
}

Assistant:

int g2d_line_intersect_line(const g2d_line_t *linea, const g2d_line_t *lineb, double *p)
{
    // this implementation is many times faster than the original,
    // mostly due to avoiding a general-purpose LU decomposition in
    // Matrix.inverse().
    double m00, m01, m10, m11;
    double i00, i01;
    double b00, b10;

    m00 = linea->u[0];
    m01= -lineb->u[0];
    m10 = linea->u[1];
    m11= -lineb->u[1];

    // determinant of m
    double det = m00*m11-m01*m10;

    // parallel lines?
    if (fabs(det) < 0.00000001)
        return 0;

    // inverse of m
    i00 = m11/det;
    i01 = -m01/det;

    b00 = lineb->p[0] - linea->p[0];
    b10 = lineb->p[1] - linea->p[1];

    double x00; //, x10;
    x00 = i00*b00+i01*b10;

    if (p != NULL) {
        p[0] = linea->u[0]*x00 + linea->p[0];
        p[1] = linea->u[1]*x00 + linea->p[1];
    }

    return 1;
}